

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  int in_EDI;
  BoundaryElement boundary_element;
  Output output;
  InteractionList mol_elem_ilist;
  InteractionList elem_ilist;
  InteractionList mol_ilist;
  InterpolationPoints elem_interp_pts;
  Tree elem_tree;
  Elements elements;
  InterpolationPoints mol_interp_pts;
  Tree mol_tree;
  Molecule molecule;
  Timers timers;
  Params params;
  Timers *in_stack_ffffffffffffeee0;
  Params *this_00;
  Timer *in_stack_ffffffffffffeef0;
  Timers_InteractionList *in_stack_ffffffffffffef08;
  undefined4 in_stack_ffffffffffffef10;
  int in_stack_ffffffffffffef14;
  undefined4 in_stack_ffffffffffffef18;
  int in_stack_ffffffffffffef1c;
  undefined4 in_stack_ffffffffffffef20;
  int in_stack_ffffffffffffef24;
  Tree *in_stack_ffffffffffffef28;
  Output *in_stack_ffffffffffffef30;
  Output *in_stack_ffffffffffffef60;
  Molecule *in_stack_ffffffffffffef68;
  InteractionList *in_stack_ffffffffffffef70;
  Tree *in_stack_ffffffffffffef78;
  InterpolationPoints *in_stack_ffffffffffffef80;
  Elements *in_stack_ffffffffffffef88;
  BoundaryElement *in_stack_ffffffffffffef90;
  Params *in_stack_ffffffffffffefa0;
  Output *in_stack_ffffffffffffefa8;
  Tree *in_stack_ffffffffffffefb0;
  InterpolationPoints *in_stack_ffffffffffffefb8;
  Output *in_stack_ffffffffffffefc0;
  Timers_Elements *in_stack_ffffffffffffefc8;
  Params *in_stack_ffffffffffffefd0;
  Molecule *in_stack_ffffffffffffefd8;
  Elements *in_stack_ffffffffffffefe0;
  Tree *in_stack_ffffffffffffeff8;
  undefined4 in_stack_fffffffffffff000;
  int in_stack_fffffffffffff004;
  Molecule *in_stack_fffffffffffff008;
  Tree *in_stack_fffffffffffff010;
  InterpolationPoints *in_stack_fffffffffffff018;
  Elements *in_stack_fffffffffffff020;
  InteractionList *in_stack_fffffffffffff030;
  InteractionList *in_stack_fffffffffffff048;
  Tree *in_stack_fffffffffffff050;
  InterpolationPoints *in_stack_fffffffffffff058;
  __node_base in_stack_fffffffffffff060;
  InterpolationPoints *in_stack_fffffffffffff068;
  Output *in_stack_fffffffffffff070;
  Molecule *in_stack_fffffffffffff130;
  Timers_Molecule *in_stack_fffffffffffff1d0;
  Params *in_stack_fffffffffffff1d8;
  Molecule *in_stack_fffffffffffff1e0;
  InterpolationPoints local_d90 [8];
  Timers *in_stack_fffffffffffff598;
  Output *in_stack_fffffffffffff5a0;
  char *in_stack_fffffffffffff5d8;
  Params *in_stack_fffffffffffff5e0;
  InterpolationPoints local_928 [24];
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 2) {
    this = std::operator<<((ostream *)&std::cout,"No input file set. Exiting.");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  Params::Params(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
  Timers::Timers(in_stack_ffffffffffffeee0);
  Timer::start((Timer *)in_stack_ffffffffffffeee0);
  Molecule::Molecule(in_stack_fffffffffffff1e0,in_stack_fffffffffffff1d8,in_stack_fffffffffffff1d0);
  Tree::Tree(in_stack_fffffffffffff010,&in_stack_fffffffffffff008->super_Particles,
             in_stack_fffffffffffff004,(Timers_Tree *)in_stack_ffffffffffffeff8);
  InterpolationPoints::InterpolationPoints
            ((InterpolationPoints *)CONCAT44(in_stack_ffffffffffffef24,in_stack_ffffffffffffef20),
             (Tree *)CONCAT44(in_stack_ffffffffffffef1c,in_stack_ffffffffffffef18),
             in_stack_ffffffffffffef14);
  Molecule::build_xyzr_file(in_stack_fffffffffffff130);
  Molecule::copyin_to_device((Molecule *)in_stack_ffffffffffffeee0);
  InterpolationPoints::copyin_to_device(local_928);
  InterpolationPoints::compute_all_interp_pts((InterpolationPoints *)in_stack_ffffffffffffefd0);
  Elements::Elements(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0,
                     in_stack_ffffffffffffefc8);
  Tree::Tree(in_stack_fffffffffffff010,&in_stack_fffffffffffff008->super_Particles,
             in_stack_fffffffffffff004,(Timers_Tree *)in_stack_ffffffffffffeff8);
  InterpolationPoints::InterpolationPoints
            ((InterpolationPoints *)CONCAT44(in_stack_ffffffffffffef24,in_stack_ffffffffffffef20),
             (Tree *)CONCAT44(in_stack_ffffffffffffef1c,in_stack_ffffffffffffef18),
             in_stack_ffffffffffffef14);
  Elements::copyin_to_device((Elements *)in_stack_ffffffffffffeee0);
  InterpolationPoints::copyin_to_device(local_d90);
  InterpolationPoints::compute_all_interp_pts((InterpolationPoints *)in_stack_ffffffffffffefd0);
  InteractionList::InteractionList
            ((InteractionList *)in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
             in_stack_ffffffffffffef24,
             (double)CONCAT44(in_stack_ffffffffffffef1c,in_stack_ffffffffffffef18),
             (Timers_InteractionList *)CONCAT44(in_stack_ffffffffffffef14,in_stack_ffffffffffffef10)
            );
  InteractionList::InteractionList
            ((InteractionList *)in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
             in_stack_ffffffffffffef24,
             (double)CONCAT44(in_stack_ffffffffffffef1c,in_stack_ffffffffffffef18),
             (Timers_InteractionList *)CONCAT44(in_stack_ffffffffffffef14,in_stack_ffffffffffffef10)
            );
  InteractionList::InteractionList
            ((InteractionList *)in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
             (Tree *)CONCAT44(in_stack_ffffffffffffef24,in_stack_ffffffffffffef20),
             in_stack_ffffffffffffef1c,
             (double)CONCAT44(in_stack_ffffffffffffef14,in_stack_ffffffffffffef10),
             in_stack_ffffffffffffef08);
  Elements::compute_source_term
            (in_stack_fffffffffffff020,in_stack_fffffffffffff018,in_stack_fffffffffffff010,
             in_stack_fffffffffffff008,
             (InterpolationPoints *)CONCAT44(in_stack_fffffffffffff004,in_stack_fffffffffffff000),
             in_stack_ffffffffffffeff8,in_stack_fffffffffffff030);
  Output::Output(in_stack_ffffffffffffef30,(Molecule *)in_stack_ffffffffffffef28,
                 (Elements *)CONCAT44(in_stack_ffffffffffffef24,in_stack_ffffffffffffef20),
                 (Params *)CONCAT44(in_stack_ffffffffffffef1c,in_stack_ffffffffffffef18),
                 (Timers_Output *)CONCAT44(in_stack_ffffffffffffef14,in_stack_ffffffffffffef10));
  this_00 = (Params *)&stack0xfffffffffffff050;
  BoundaryElement::BoundaryElement
            (in_stack_ffffffffffffef90,in_stack_ffffffffffffef88,in_stack_ffffffffffffef80,
             in_stack_ffffffffffffef78,in_stack_ffffffffffffef70,in_stack_ffffffffffffef68,
             in_stack_ffffffffffffefa0,in_stack_ffffffffffffefa8,
             (Timers_BoundaryElement *)in_stack_ffffffffffffefb0);
  BoundaryElement::run_GMRES((BoundaryElement *)in_stack_fffffffffffff010);
  Output::compute_coulombic_energy
            (in_stack_ffffffffffffefc0,in_stack_ffffffffffffefb8,in_stack_ffffffffffffefb0,
             (InteractionList *)in_stack_ffffffffffffefa8);
  Output::compute_solvation_energy
            (in_stack_fffffffffffff070,in_stack_fffffffffffff068,
             (Tree *)in_stack_fffffffffffff060._M_nxt,in_stack_fffffffffffff058,
             in_stack_fffffffffffff050,in_stack_fffffffffffff048);
  Output::finalize(in_stack_ffffffffffffef60);
  Molecule::delete_from_device((Molecule *)this_00);
  InterpolationPoints::delete_from_device(local_928);
  Elements::delete_from_device((Elements *)this_00);
  InterpolationPoints::delete_from_device(local_d90);
  Timer::stop(in_stack_ffffffffffffeef0);
  Output::files(in_stack_fffffffffffff5a0,in_stack_fffffffffffff598);
  local_4 = 0;
  BoundaryElement::~BoundaryElement((BoundaryElement *)this_00);
  Output::~Output((Output *)0x104d45);
  InteractionList::~InteractionList((InteractionList *)this_00);
  InteractionList::~InteractionList((InteractionList *)this_00);
  InteractionList::~InteractionList((InteractionList *)this_00);
  InterpolationPoints::~InterpolationPoints((InterpolationPoints *)this_00);
  Tree::~Tree((Tree *)this_00);
  Elements::~Elements((Elements *)this_00);
  InterpolationPoints::~InterpolationPoints((InterpolationPoints *)this_00);
  Tree::~Tree((Tree *)this_00);
  Molecule::~Molecule((Molecule *)this_00);
  Params::~Params(this_00);
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
    // set the parameter struct, which is read in from file provided as argv
    if (argc < 2) { 
        std::cout << "No input file set. Exiting." << std::endl; 
        std::exit(1);
    }
    struct Params params(argv[1]);
    struct Timers timers;
    
    timers.tabipb.start();
    
    //construct the biomolecule from the provided pqr file
    class Molecule molecule(params, timers.molecule);
    class Tree mol_tree(molecule, params.tree_max_per_leaf_, timers.tree);
    class InterpolationPoints mol_interp_pts(mol_tree, params.tree_degree_);

    molecule.build_xyzr_file();
    molecule.copyin_to_device();
    mol_interp_pts.copyin_to_device();
    mol_interp_pts.compute_all_interp_pts();
    
    // build particles from a NanoShaper surface generated by xyzr file
    // then build a tree on the particles, partitioning them
    class Elements elements(molecule, params, timers.elements);
    class Tree elem_tree(elements, params.tree_max_per_leaf_, timers.tree);
    class InterpolationPoints elem_interp_pts(elem_tree, params.tree_degree_);
    
    elements.copyin_to_device();
    elem_interp_pts.copyin_to_device();
    elem_interp_pts.compute_all_interp_pts();

    class InteractionList mol_ilist(mol_tree, params.tree_degree_, params.tree_theta_,
                                    timers.interaction_list);
    class InteractionList elem_ilist(elem_tree, params.tree_degree_, params.tree_theta_,
                                    timers.interaction_list);
    class InteractionList mol_elem_ilist(elem_tree, mol_tree, params.tree_degree_, params.tree_theta_,
                                    timers.interaction_list);

    //elements.compute_source_term();
    elements.compute_source_term(elem_interp_pts, elem_tree, molecule, mol_interp_pts, mol_tree, mol_elem_ilist);
    
    
    /* energies, potential, and outfile routines are contained in output */
    class Output output(molecule, elements, params, timers.output);
    
    // initialize the boundary element method
    class BoundaryElement boundary_element(elements, elem_interp_pts, elem_tree, elem_ilist, molecule,
                                           params, output, timers.boundary_element);
    
    boundary_element.run_GMRES();

    //output.compute_coulombic_energy();
    //output.compute_solvation_energy();
    output.compute_coulombic_energy(mol_interp_pts, mol_tree, mol_ilist);
    output.compute_solvation_energy(elem_interp_pts, elem_tree, mol_interp_pts, mol_tree, mol_elem_ilist);
    output.finalize();

    molecule.delete_from_device();
    mol_interp_pts.delete_from_device();
    
    elements.delete_from_device();
    elem_interp_pts.delete_from_device();
    
    timers.tabipb.stop();
    
    output.files(timers);
    
    return 0;
}